

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O3

auto_ptr<cmCryptoHash> __thiscall cmCryptoHash::New(cmCryptoHash *this,char *algo)

{
  int iVar1;
  _func_int **pp_Var2;
  cmsysMD5 *pcVar3;
  
  iVar1 = strcmp(algo,"MD5");
  if (iVar1 == 0) {
    pp_Var2 = (_func_int **)operator_new(0x10);
    *pp_Var2 = (_func_int *)&PTR__cmCryptoHashMD5_005cab60;
    pcVar3 = cmsysMD5_New();
  }
  else {
    iVar1 = strcmp(algo,"SHA1");
    if (iVar1 == 0) {
      pp_Var2 = (_func_int **)operator_new(0x10);
      *pp_Var2 = (_func_int *)&PTR__cmCryptoHashSHA1_005cab98;
      pcVar3 = (cmsysMD5 *)operator_new(0xd0);
    }
    else {
      iVar1 = strcmp(algo,"SHA224");
      if (iVar1 == 0) {
        pp_Var2 = (_func_int **)operator_new(0x10);
        *pp_Var2 = (_func_int *)&PTR__cmCryptoHashSHA224_005cabd0;
        pcVar3 = (cmsysMD5 *)operator_new(0xd0);
      }
      else {
        iVar1 = strcmp(algo,"SHA256");
        if (iVar1 == 0) {
          pp_Var2 = (_func_int **)operator_new(0x10);
          *pp_Var2 = (_func_int *)&PTR__cmCryptoHashSHA256_005cac08;
          pcVar3 = (cmsysMD5 *)operator_new(0xd0);
        }
        else {
          iVar1 = strcmp(algo,"SHA384");
          if (iVar1 == 0) {
            pp_Var2 = (_func_int **)operator_new(0x10);
            *pp_Var2 = (_func_int *)&PTR__cmCryptoHashSHA384_005cac40;
            pcVar3 = (cmsysMD5 *)operator_new(0xd0);
          }
          else {
            iVar1 = strcmp(algo,"SHA512");
            if (iVar1 != 0) {
              pp_Var2 = (_func_int **)0x0;
              goto LAB_0033d925;
            }
            pp_Var2 = (_func_int **)operator_new(0x10);
            *pp_Var2 = (_func_int *)&PTR__cmCryptoHashSHA512_005cac78;
            pcVar3 = (cmsysMD5 *)operator_new(0xd0);
          }
        }
      }
    }
  }
  pp_Var2[1] = (_func_int *)pcVar3;
LAB_0033d925:
  this->_vptr_cmCryptoHash = pp_Var2;
  return (auto_ptr<cmCryptoHash>)this;
}

Assistant:

cmsys::auto_ptr<cmCryptoHash> cmCryptoHash::New(const char* algo)
{
  if(strcmp(algo,"MD5") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashMD5); }
  else if(strcmp(algo,"SHA1") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA1); }
  else if(strcmp(algo,"SHA224") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA224); }
  else if(strcmp(algo,"SHA256") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA256); }
  else if(strcmp(algo,"SHA384") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA384); }
  else if(strcmp(algo,"SHA512") == 0)
    { return cmsys::auto_ptr<cmCryptoHash>(new cmCryptoHashSHA512); }
  else
    { return cmsys::auto_ptr<cmCryptoHash>(0); }
}